

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O2

string * __thiscall
iDynTree::Material::texture_abi_cxx11_(string *__return_storage_ptr__,Material *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_texture);
  return __return_storage_ptr__;
}

Assistant:

std::string Material::texture() const { return m_texture; }